

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O3

void Image_Function_Helper::Rotate
               (RotateForm4 rotate,Image *in,double centerXIn,double centerYIn,Image *out,
               double centerXOut,double centerYOut,double angle)

{
  EVP_PKEY_CTX *src;
  ImageTemplate<unsigned_char> local_48;
  
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>(in,out);
  local_48._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00124c30;
  local_48._data = (uchar *)0x0;
  local_48._type = out->_type;
  PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_48,(EVP_PKEY_CTX *)out,src);
  Image_Function::VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(in);
  Image_Function::VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(&local_48);
  local_48._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00124c30;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_48);
  (*rotate)(in,0,0,centerXIn,centerYIn,out,0,0,centerXOut,centerYOut,in->_width,in->_height,angle);
  return;
}

Assistant:

void Rotate( FunctionTable::RotateForm4 rotate,
                 const Image & in, double centerXIn, double centerYIn, Image & out, double centerXOut, double centerYOut, double angle )
    {
        Image_Function::ParameterValidation( in, out );
        Image_Function::VerifyGrayScaleImage( in, out );
        rotate( in, 0, 0, centerXIn, centerYIn, out, 0, 0, centerXOut, centerYOut, in.width(), in.height(), angle );
    }